

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::DoPush
          (TestBuilder *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  long lVar1;
  TestBuilder *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000070;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000078;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DoPush(in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (in_stack_00000078,in_stack_00000070);
  *(undefined1 *)(in_RDI + 0xc0) = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoPush(const std::vector<unsigned char>& data)
    {
        DoPush();
        push = data;
        havePush = true;
    }